

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

void __thiscall notch::io::LayerSpec::LayerSpec(LayerSpec *this,ALossLayer *layer)

{
  int iVar1;
  undefined4 extraout_var;
  string local_38 [8];
  string tag;
  ALossLayer *layer_local;
  LayerSpec *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->inputDim = 0;
  this->outputDim = 0;
  core::std::
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  shared_ptr(&this->activation,(nullptr_t)0x0);
  core::std::shared_ptr<std::valarray<float>_>::shared_ptr(&this->weights,(nullptr_t)0x0);
  core::std::shared_ptr<std::valarray<float>_>::shared_ptr(&this->bias,(nullptr_t)0x0);
  (**layer->_vptr_ALossLayer)(local_38);
  std::__cxx11::string::operator=((string *)this,local_38);
  iVar1 = (*layer->_vptr_ALossLayer[4])();
  this->inputDim = CONCAT44(extraout_var,iVar1);
  this->outputDim = 0;
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

LayerSpec(const ALossLayer &layer) {
        std::string tag = layer.tag();
        this->tag = tag;
        this->inputDim = layer.inputDim();
        this->outputDim = 0;
    }